

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnFunction
          (BinaryReaderObjdump *this,Index index,Index sig_index)

{
  mapped_type *pmVar1;
  string_view sVar2;
  Index local_1c;
  
  local_1c = index;
  PrintDetails(this," - func[%u] sig=%u",index,(ulong)sig_index);
  sVar2 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names,
                            index);
  if (sVar2._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar2._M_len,sVar2._M_str);
  }
  PrintDetails(this,"\n");
  pmVar1 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_types,
                        &local_1c);
  *pmVar1 = sig_index;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnFunction(Index index, Index sig_index) {
  PrintDetails(" - func[%" PRIindex "] sig=%" PRIindex, index, sig_index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  objdump_state_->function_types[index] = sig_index;
  return Result::Ok;
}